

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_write_plain(connectdata *conn,curl_socket_t sockfd,void *mem,size_t len,
                         ssize_t *written)

{
  ssize_t sVar1;
  CURLcode local_3c;
  int num;
  CURLcode retcode;
  ssize_t bytes_written;
  ssize_t *written_local;
  size_t len_local;
  void *mem_local;
  connectdata *pcStack_10;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  bytes_written = (ssize_t)written;
  written_local = (ssize_t *)len;
  len_local = (size_t)mem;
  mem_local._4_4_ = sockfd;
  pcStack_10 = conn;
  sVar1 = Curl_send_plain(conn,(uint)(sockfd == conn->sock[1]),mem,len,&local_3c);
  *(ssize_t *)bytes_written = sVar1;
  return local_3c;
}

Assistant:

CURLcode Curl_write_plain(struct connectdata *conn,
                          curl_socket_t sockfd,
                          const void *mem,
                          size_t len,
                          ssize_t *written)
{
  ssize_t bytes_written;
  CURLcode retcode;
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  bytes_written = Curl_send_plain(conn, num, mem, len, &retcode);

  *written = bytes_written;

  return retcode;
}